

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaD_poscall(lua_State *L,StkId firstResult)

{
  StkId pTVar1;
  int iVar2;
  CallInfo *pCVar3;
  int iVar4;
  StkId pTVar5;
  
  pCVar3 = L->ci;
  L->ci = pCVar3 + -1;
  pTVar5 = pCVar3->func;
  iVar2 = pCVar3->nresults;
  L->base = pCVar3[-1].base;
  L->savedpc = pCVar3[-1].savedpc;
  iVar4 = iVar2;
  if (iVar2 != 0) {
    do {
      if (L->top <= firstResult) goto LAB_00106e77;
      pTVar1 = pTVar5 + 1;
      pTVar5->value = firstResult->value;
      pTVar5->tt = firstResult->tt;
      firstResult = firstResult + 1;
      iVar4 = iVar4 + -1;
      pTVar5 = pTVar1;
    } while (iVar4 != 0);
    iVar4 = 0;
  }
LAB_00106e77:
  if (0 < iVar4) {
    iVar4 = iVar4 + 1;
    do {
      pTVar5->tt = 0;
      pTVar5 = pTVar5 + 1;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  }
  L->top = pTVar5;
  return iVar2 + 1;
}

Assistant:

static int luaD_poscall(lua_State*L,StkId firstResult){
StkId res;
int wanted,i;
CallInfo*ci;
ci=L->ci--;
res=ci->func;
wanted=ci->nresults;
L->base=(ci-1)->base;
L->savedpc=(ci-1)->savedpc;
for(i=wanted;i!=0&&firstResult<L->top;i--)
setobj(L,res++,firstResult++);
while(i-->0)
setnilvalue(res++);
L->top=res;
return(wanted-(-1));
}